

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_BuildInFunctionIfDefined_Test::
~SemanticAnalyserTest_BuildInFunctionIfDefined_Test
          (SemanticAnalyserTest_BuildInFunctionIfDefined_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_BuildInFunctionIfDefined_Test
            ((SemanticAnalyserTest_BuildInFunctionIfDefined_Test *)0x1e8c58);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, BuildInFunctionIfDefined)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let x: f32 = if(1 == 1, 1, 0);
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}